

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_>::int_writer
          (int_writer<char,_duckdb_fmt::v6::basic_format_specs<char>_> *this,
          basic_writer<duckdb_fmt::v6::buffer_range<char>_> *w,char value,
          basic_format_specs<char> *s)

{
  char cVar1;
  byte bVar2;
  unsigned_type uVar3;
  undefined7 in_register_00000011;
  
  this->writer = w;
  this->specs = s;
  uVar3 = (unsigned_type)CONCAT71(in_register_00000011,value);
  this->abs_value = uVar3;
  this->prefix_size = 0;
  if (-1 < value) {
    bVar2 = (byte)s->field_0x9 >> 4 & 7;
    if (1 < bVar2) {
      cVar1 = ' ';
      if (bVar2 == 2) {
        cVar1 = '+';
      }
      this->prefix[0] = cVar1;
      this->prefix_size = 1;
    }
    return;
  }
  this->prefix[0] = '-';
  this->prefix_size = 1;
  this->abs_value = -uVar3;
  return;
}

Assistant:

int_writer(basic_writer<Range>& w, Int value, const Specs& s)
        : writer(w),
          specs(s),
          abs_value(static_cast<unsigned_type>(value)),
          prefix_size(0) {
      if (is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (specs.sign != sign::none && specs.sign != sign::minus) {
        prefix[0] = specs.sign == sign::plus ? '+' : ' ';
        ++prefix_size;
      }
    }